

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shop.cpp
# Opt level: O1

void __thiscall SHOPManagement::Shop::buyProduct(Shop *this,Customer *pCustomer)

{
  pointer ppPVar1;
  Product *this_00;
  int iVar2;
  longdouble in_ST0;
  longdouble in_ST1;
  int product_quantity;
  int new_quantity;
  int product_id;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  longdouble local_3c;
  
  local_40 = -1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Product ID: ",0xc);
  std::istream::operator>>((istream *)&std::cin,&local_40);
  local_40 = searchProductById(this,&local_40);
  if (local_40 == -1) {
    std::__cxx11::string::_M_replace(0x111240,0,DAT_00111248,0x10c780);
  }
  else {
    ppPVar1 = (this->v_products).
              super__Vector_base<SHOPManagement::Product_*,_std::allocator<SHOPManagement::Product_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->v_products).
                      super__Vector_base<SHOPManagement::Product_*,_std::allocator<SHOPManagement::Product_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3) <=
        (ulong)(long)local_40) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    this_00 = ppPVar1[local_40];
    iVar2 = Product::getQuantity(this_00);
    if (0 < iVar2) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Quantity: ",10);
        std::istream::operator>>((istream *)&std::cin,&local_4c);
        iVar2 = Product::getQuantity(this_00);
      } while (local_4c < 1 || iVar2 < local_4c);
      local_44 = Product::getQuantity(this_00);
      local_44 = local_44 - local_4c;
      Product::setQuantity(this_00,&local_44);
      Customer::getBalance(pCustomer);
      local_3c = in_ST0;
      Product::getPrice(this_00);
      local_48 = local_4c;
      Customer::setBalance(pCustomer,local_3c + in_ST1 * (longdouble)local_4c);
    }
  }
  return;
}

Assistant:

void Shop::buyProduct(Customer *pCustomer)
    {
        int product_id = -1;
        std::cout << "Product ID: ";
        std::cin >> product_id;

        product_id = searchProductById(product_id);

        if (product_id != -1)
        {
            Product *pProduct = this->v_products.at(product_id);

            if (pProduct->getQuantity() > 0)
            {
                int product_quantity;

                do
                {
                    std::cout << "Quantity: ";
                    std::cin >> product_quantity;
                } while (pProduct->getQuantity() < product_quantity || product_quantity < 1);

                int new_quantity = pProduct->getQuantity() - product_quantity;
                pProduct->setQuantity(new_quantity);
                long double new_balance = pCustomer->getBalance() + (pProduct->getPrice() * product_quantity);
                pCustomer->setBalance(new_balance);
            }
        }
        else
        {
            Helper::m_message = "Product was not found.";
        }
    }